

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

char * val_type(byte typeID)

{
  if ('{' < (char)typeID) {
    return &DAT_00109678 + *(int *)(&DAT_00109678 + (ulong)(byte)(typeID + 0x84) * 4);
  }
  fwrite("\nwrong typeID\n",0xe,1,_stderr);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Kingdo777[P]WCasm/cmd/wcasm-objdump/print.c"
                ,0x6f,"const char *val_type(byte)");
}

Assistant:

const char *val_type(byte typeID) {
    switch (typeID) {
        case I32:
            return "i32";
        case I64:
            return "i64";
        case F32:
            return "f32";
        case F64:
            return "f64";
        default:
            errorExit("\nwrong typeID\n");
    }
}